

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
Wrapper<CustomUintFormatter<8,false>,ServiceFlags_const&>::
Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
          (Wrapper<CustomUintFormatter<8,false>,ServiceFlags_const&> *this,
          ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s)

{
  long in_FS_OFFSET;
  CustomUintFormatter<8,false> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CustomUintFormatter<8,false>::
  Ser<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,ServiceFlags>
            (&local_9,s,**(ServiceFlags **)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Wrapper(T obj) : m_object(obj) {}